

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 *__src;
  ImVec2 IVar4;
  ImVec2 *__dest;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  float x1;
  float y1;
  float fVar9;
  float fVar10;
  float fVar11;
  
  IVar1 = (this->_Path).Data[(long)(this->_Path).Size + -1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments != 0) {
    if (0 < num_segments) {
      iVar5 = 1;
      do {
        IVar1 = *p2;
        IVar2 = *p3;
        iVar7 = (this->_Path).Size;
        iVar3 = (this->_Path).Capacity;
        if (iVar7 == iVar3) {
          if (iVar3 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar3 / 2 + iVar3;
          }
          iVar7 = iVar7 + 1;
          if (iVar7 < iVar6) {
            iVar7 = iVar6;
          }
          if (iVar3 < iVar7) {
            __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
            __src = (this->_Path).Data;
            if (__src != (ImVec2 *)0x0) {
              memcpy(__dest,__src,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = __dest;
            (this->_Path).Capacity = iVar7;
          }
        }
        fVar11 = (float)iVar5 * (1.0 / (float)num_segments);
        fVar9 = 1.0 - fVar11;
        fVar10 = (fVar9 + fVar9) * fVar11;
        IVar4.y = fVar11 * fVar11 * IVar2.y + fVar9 * fVar9 * y1 + fVar10 * IVar1.y;
        IVar4.x = fVar11 * fVar11 * IVar2.x + fVar9 * fVar9 * x1 + fVar10 * IVar1.x;
        (this->_Path).Data[(this->_Path).Size] = IVar4;
        (this->_Path).Size = (this->_Path).Size + 1;
        bVar8 = iVar5 != num_segments;
        iVar5 = iVar5 + 1;
      } while (bVar8);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}